

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O1

bool renderSimilarity(TKeyPressCollection *keyPresses,TSimilarityMap *similarityMap)

{
  ulong uVar1;
  pointer psVar2;
  bool bVar3;
  ImU32 IVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  uint local_bc;
  ImVec4 local_b8;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ulong local_98;
  ImDrawList *local_90;
  ImVec2 local_88;
  TKeyPressCollection *local_70;
  ImVec2 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fVar10 = stateUI.super_stStateUI.windowHeightTitleBar +
           stateUI.super_stStateUI.windowHeightKeyPesses +
           stateUI.super_stStateUI.windowHeightResults;
  local_b8._0_8_ = (ulong)(uint)(float)(int)fVar10 << 0x20;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_70 = keyPresses;
  ImGui::SetNextWindowPos((ImVec2 *)&local_b8,1,&local_a8);
  local_b8.x = (float)g_windowSizeX;
  local_b8.y = (float)(g_windowSizeY - (int)fVar10);
  ImGui::SetNextWindowSize((ImVec2 *)&local_b8,1);
  bVar3 = ImGui::Begin("Similarity",(bool *)0x0,0x804);
  if (bVar3) {
    local_88 = ImGui::GetContentRegionAvail();
    ImGui::PushItemWidth(100.0);
    uVar9 = ((long)(similarityMap->
                   super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(similarityMap->
                   super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    ImGui::SameLine(0.0,-1.0);
    ImGui::SliderFloat("Size",&renderSimilarity::bsize,1.5,24.0,"%.3f",1.0);
    ImGui::SameLine(0.0,-1.0);
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    bVar3 = ImGui::Button("Fit",(ImVec2 *)&local_b8);
    uVar8 = (uint)uVar9;
    if (bVar3) {
      fVar10 = local_88.y;
      if (local_88.x <= local_88.y) {
        fVar10 = local_88.x;
      }
      renderSimilarity::bsize = (fVar10 + -24.0) / (float)(int)uVar8;
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::SliderFloat("Threshold",&renderSimilarity::threshold,0.0,1.0,"%.3f",1.0);
    ImGui::PopItemWidth();
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    ImGui::BeginChild("Canvas",(ImVec2 *)&local_b8,true,0xc800);
    local_68 = ImGui::GetCursorScreenPos();
    local_90 = ImGui::GetWindowDrawList();
    if ((int)uVar8 < 1) {
      local_b8.x = 1.0;
      local_b8.y = 0.3;
      local_b8.z = 0.4;
      local_b8.w = 1.0;
      ImGui::TextColored(&local_b8,"Waiting for similarity map to be available!");
    }
    else {
      local_b8.y = (float)(int)uVar8 * renderSimilarity::bsize;
      local_b8.x = (float)(int)uVar8 * renderSimilarity::bsize;
      local_88 = (ImVec2)similarityMap;
      ImGui::InvisibleButton("SimilarityMapIB",(ImVec2 *)&local_b8);
      local_bc = 0xffffffff;
      uVar7 = 0;
      local_98 = uVar9;
      do {
        uVar6 = (uint)uVar7;
        local_48 = ZEXT416((uint)(float)(int)uVar6);
        local_58 = ZEXT416((uint)(float)(int)(uVar6 + 1));
        lVar5 = 0;
        uVar9 = 0;
        do {
          local_a8.x = (float)(int)uVar9 * renderSimilarity::bsize + local_68.x;
          local_a8.y = (float)local_48._0_4_ * renderSimilarity::bsize + local_68.y;
          uVar1 = uVar9 + 1;
          local_a0.y = (float)local_58._0_4_ * renderSimilarity::bsize + local_68.y + -1.0;
          local_a0.x = (float)(int)uVar1 * renderSimilarity::bsize + local_68.x + -1.0;
          if ((double)renderSimilarity::threshold <
              *(double *)(*(long *)(*(long *)local_88 + uVar7 * 0x18) + lVar5)) {
            local_b8.y = (float)*(double *)(*(long *)(*(long *)local_88 + uVar7 * 0x18) + lVar5);
            local_b8.x = 1.0 - local_b8.y;
            local_b8._8_8_ = (ulong)(uint)local_b8.y << 0x20;
            IVar4 = ImGui::ColorConvertFloat4ToU32(&local_b8);
            ImDrawList::AddRectFilled(local_90,&local_a8,&local_a0,IVar4,0.0,0xf);
          }
          local_b8.x = local_a0.x + 1.0;
          local_b8.y = local_a0.y + 1.0;
          bVar3 = ImGui::IsMouseHoveringRect(&local_a8,(ImVec2 *)&local_b8,true);
          if (bVar3) {
            if (uVar7 == uVar9) {
              local_bc = uVar6;
            }
            bVar3 = ImGui::IsMouseDown(0);
            if (!bVar3) {
              ImGui::BeginTooltip();
              ImGui::Text("[%3d, %3d] = %5.4g\n",
                          *(undefined8 *)(*(long *)(*(long *)local_88 + uVar7 * 0x18) + lVar5),
                          uVar7 & 0xffffffff,uVar9 & 0xffffffff);
              ImGui::EndTooltip();
            }
          }
          lVar5 = lVar5 + 0x10;
          uVar9 = uVar1;
        } while ((uVar8 & 0x7fffffff) != uVar1);
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uVar8 & 0x7fffffff));
      if (-1 < (int)local_bc) {
        local_98 = (ulong)((uint)local_98 & 0x7fffffff);
        lVar5 = 0x20;
        uVar9 = 0;
        do {
          psVar2 = (local_70->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(int *)((long)&(psVar2->waveform).samples + lVar5) == psVar2[local_bc].cid) {
            fVar10 = (float)(int)uVar9 * renderSimilarity::bsize;
            local_a8.x = fVar10 + local_68.x;
            local_a8.y = fVar10 + local_68.y;
            fVar10 = (float)((int)uVar9 + 1) * renderSimilarity::bsize;
            local_a0.x = fVar10 + local_68.x + -1.0;
            local_a0.y = fVar10 + local_68.y + -1.0;
            local_b8.x = 1.0;
            local_b8.y = 0.0;
            local_b8.z = 0.0;
            local_b8.w = 1.0;
            IVar4 = ImGui::ColorConvertFloat4ToU32(&local_b8);
            ImDrawList::AddRectFilled(local_90,&local_a8,&local_a0,IVar4,0.0,0xf);
          }
          uVar9 = uVar9 + 1;
          lVar5 = lVar5 + 0x30;
        } while (local_98 != uVar9);
      }
    }
    ImGui::EndChild();
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
  }
  else {
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
  }
  ImGui::End();
  return false;
}

Assistant:

bool renderSimilarity(const TKeyPressCollection & keyPresses, const TSimilarityMap & similarityMap) {
    int offsetY = stateUI.windowHeightTitleBar + stateUI.windowHeightKeyPesses + stateUI.windowHeightResults;
    ImGui::SetNextWindowPos(ImVec2(0, offsetY), ImGuiCond_Always);
    ImGui::SetNextWindowSize(ImVec2(1.0f*g_windowSizeX, g_windowSizeY - offsetY), ImGuiCond_Always);
    if (ImGui::Begin("Similarity", nullptr, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_NoMove)) {
        auto wsize = ImGui::GetContentRegionAvail();

        static float bsize = 10.0f;
        static float threshold = 0.0f;
        ImGui::PushItemWidth(100.0);

        int n = similarityMap.size();
        ImGui::SameLine();
        ImGui::SliderFloat("Size", &bsize, 1.5f, 24.0f);
        ImGui::SameLine();
        if (ImGui::Button("Fit")) {
            bsize = (std::min(wsize.x, wsize.y) - 24.0)/n;
        }
        ImGui::SameLine();
        ImGui::SliderFloat("Threshold", &threshold, 0.0f, 1.0f);
        ImGui::PopItemWidth();

        ImGui::BeginChild("Canvas", { 0, 0 }, 1, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_AlwaysVerticalScrollbar);
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();

        int hoveredId = -1;
        if (n > 0) {
            ImGui::InvisibleButton("SimilarityMapIB", { n*bsize, n*bsize });
            for (int i = 0; i < n; ++i) {
                for (int j = 0; j < n; ++j) {
                    float col = similarityMap[i][j].cc;
                    ImVec2 p0 = {savePos.x + j*bsize, savePos.y + i*bsize};
                    ImVec2 p1 = {savePos.x + (j + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                    if (similarityMap[i][j].cc > threshold) {
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32(ImVec4{1.0f - col, col, 0.0f, col}));
                    }
                    if (ImGui::IsMouseHoveringRect(p0, {p1.x + 1.0f, p1.y + 1.0f})) {
                        if (i == j) hoveredId = i;
                        if (ImGui::IsMouseDown(0) == false) {
                            ImGui::BeginTooltip();
                            //ImGui::Text("[%3d, %3d]\n", keyPresses[i].cid, keyPresses[j].cid);
                            ImGui::Text("[%3d, %3d] = %5.4g\n", i, j, similarityMap[i][j].cc);
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[i][k].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", i, k, (int) similarityMap[i][k].offset);
                            //}
                            //ImGui::Separator();
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[k][i].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", k, i, (int) similarityMap[k][i].offset);
                            //}
                            ImGui::EndTooltip();
                        }
                    }
                }
            }

            if (hoveredId >= 0) {
                for (int i = 0; i < n; ++i) {
                    if (keyPresses[i].cid == keyPresses[hoveredId].cid) {
                        ImVec2 p0 = {savePos.x + i*bsize, savePos.y + i*bsize};
                        ImVec2 p1 = {savePos.x + (i + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({1.0f, 0.0f, 0.0f, 1.0f}));
                    }
                }
            }
        } else {
            ImGui::TextColored({1.0f, 0.3f, 0.4f, 1.0f}, "Waiting for similarity map to be available!");
        }

        ImGui::EndChild();

        stateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();
    return false;
}